

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip-test.c++
# Opt level: O3

ssize_t __thiscall
kj::anon_unknown_0::MockOutputStream::write(MockOutputStream *this,int __fd,void *__buf,size_t __n)

{
  void *__src;
  size_t __n_00;
  uchar *puVar1;
  uchar *puVar2;
  RemoveConst<unsigned_char> *in_RAX;
  RemoveConst<unsigned_char> *extraout_RAX;
  undefined8 *puVar3;
  ArrayPtr<const_unsigned_char> *__begin2;
  undefined4 in_register_00000034;
  undefined8 *puVar4;
  RemoveConst<unsigned_char> *pRVar5;
  RemoveConst<unsigned_char> *__dest;
  
  puVar4 = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  if (__buf != (void *)0x0) {
    puVar3 = puVar4 + (long)__buf * 2;
    __dest = (this->bytes).builder.pos;
    do {
      __src = (void *)*puVar4;
      __n_00 = puVar4[1];
      puVar1 = (this->bytes).builder.ptr;
      puVar2 = (this->bytes).builder.endPtr;
      in_RAX = __dest + (__n_00 - (long)puVar1);
      pRVar5 = puVar2 + -(long)puVar1;
      if (pRVar5 < in_RAX) {
        pRVar5 = (RemoveConst<unsigned_char> *)((long)pRVar5 * 2);
        if (puVar2 == puVar1) {
          pRVar5 = (RemoveConst<unsigned_char> *)0x4;
        }
        if (pRVar5 < in_RAX) {
          pRVar5 = in_RAX;
        }
        Vector<unsigned_char>::setCapacity(&this->bytes,(size_t)pRVar5);
        __dest = (this->bytes).builder.pos;
        in_RAX = extraout_RAX;
      }
      if (__n_00 != 0) {
        in_RAX = (RemoveConst<unsigned_char> *)memcpy(__dest,__src,__n_00);
        __dest = __dest + __n_00;
      }
      (this->bytes).builder.pos = __dest;
      puVar4 = puVar4 + 2;
    } while (puVar4 != puVar3);
  }
  return (ssize_t)in_RAX;
}

Assistant:

void write(ArrayPtr<const ArrayPtr<const byte>> pieces) override {
    for (auto& piece: pieces) {
      bytes.addAll(piece);
    }
  }